

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVarLengthArray<QFixedPoint,_128LL>::QVarLengthArray
          (QVarLengthArray<QFixedPoint,_128LL> *this,qsizetype asize)

{
  void *pvVar1;
  
  (this->super_QVLABase<QFixedPoint>).super_QVLABaseBase.a = 0x80;
  (this->super_QVLABase<QFixedPoint>).super_QVLABaseBase.s = 0;
  (this->super_QVLABase<QFixedPoint>).super_QVLABaseBase.ptr =
       &this->super_QVLAStorage<8UL,_4UL,_128LL>;
  if (0x80 < asize) {
    (this->super_QVLABase<QFixedPoint>).super_QVLABaseBase.a = asize;
    pvVar1 = QtPrivate::fittedMalloc(0,(qsizetype *)this,8,0);
    (this->super_QVLABase<QFixedPoint>).super_QVLABaseBase.ptr = pvVar1;
  }
  (this->super_QVLABase<QFixedPoint>).super_QVLABaseBase.s = asize;
  return;
}

Assistant:

Q_INLINE_TEMPLATE QVarLengthArray<T, Prealloc>::QVarLengthArray(qsizetype asize)
    : QVarLengthArray()
{
    Q_ASSERT_X(asize >= 0, "QVarLengthArray::QVarLengthArray(qsizetype)",
               "Size must be greater than or equal to 0.");

    // historically, this ctor worked for non-copyable/non-movable T, so keep it working, why not?
    // resize(asize) // this requires a movable or copyable T, can't use, need to do it by hand

    if (asize > Prealloc) {
        this->a = asize;
        this->ptr = QtPrivate::fittedMalloc(0, &this->a, sizeof(T));
        Q_CHECK_PTR(this->ptr);
    }
    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_default_construct_n(data(), asize);
    this->s = asize;
}